

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandwidthControlTest.cpp
# Opt level: O0

void __thiscall test::BWCTestConnection::OnConnect(BWCTestConnection *this)

{
  TonkStatusEx statusEx;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffb88;
  LogStringBuffer *in_stack_fffffffffffffb90;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffffbd0;
  char acStack_3fe [40];
  ushort local_3d6 [23];
  ushort *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined8 *local_388;
  ushort *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined4 local_35c;
  undefined8 *local_358;
  undefined4 local_34c;
  undefined8 *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  ushort *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  ushort *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  undefined *local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined *local_128;
  undefined1 *local_120;
  ushort *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  ushort *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  char *local_80;
  undefined1 *local_78;
  ushort *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  char *local_38;
  undefined1 *local_30;
  ushort *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  ushort *local_10;
  undefined1 *local_8;
  
  tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffffb90);
  local_398 = acStack_3fe;
  local_3a8 = local_3d6;
  local_388 = &Logger;
  local_390 = "Connected with ";
  local_3a0 = " : ";
  local_358 = &Logger;
  local_35c = 1;
  local_368 = "Connected with ";
  local_378 = " : ";
  buffer_00 = (LogStringBuffer *)&Logger;
  local_348 = &Logger;
  local_34c = 1;
  if (DAT_002b5840 < 2) {
    local_180 = &Logger;
    local_184 = 1;
    local_190 = "Connected with ";
    local_1a0 = " : ";
    local_380 = local_3a8;
    local_370 = local_398;
    local_1a8 = local_3a8;
    local_198 = local_398;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,Trace);
    local_158 = &DAT_002b5870;
    local_148 = &Logger;
    local_160 = local_190;
    local_168 = local_198;
    local_170 = local_1a0;
    local_178 = local_1a8;
    local_130 = &Logger;
    local_150 = local_330;
    local_140 = local_158;
    local_138 = local_330;
    local_128 = local_158;
    local_120 = local_330;
    std::operator<<(aoStack_320,(string *)&DAT_002b5870);
    local_f0 = &Logger;
    local_f8 = local_150;
    local_100 = local_160;
    local_108 = local_168;
    local_110 = local_170;
    local_118 = local_178;
    local_d8 = &Logger;
    local_e0 = local_150;
    local_e8 = local_160;
    local_a0 = local_150;
    local_a8 = local_160;
    std::operator<<((ostream *)(local_150 + 0x10),local_160);
    local_b0 = &Logger;
    local_b8 = local_f8;
    local_c0 = local_108;
    local_c8 = local_110;
    local_d0 = local_118;
    local_88 = &Logger;
    local_90 = local_f8;
    local_98 = local_108;
    local_78 = local_f8;
    local_80 = local_108;
    std::operator<<((ostream *)(local_f8 + 0x10),local_108);
    local_58 = &Logger;
    local_60 = local_b8;
    local_68 = local_c8;
    local_70 = local_d0;
    local_40 = &Logger;
    local_48 = local_b8;
    local_50 = local_c8;
    local_30 = local_b8;
    local_38 = local_c8;
    std::operator<<((ostream *)(local_b8 + 0x10),local_c8);
    local_18 = &Logger;
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffffbd0,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x11ae14);
  }
  return;
}

Assistant:

void BWCTestConnection::OnConnect()
{
    //TonkStatus status = GetStatus();
    TonkStatusEx statusEx = GetStatusEx();
    Logger.Debug("Connected with ", statusEx.Remote.NetworkString, " : ", statusEx.Remote.UDPPort);
}